

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall resetOnNewSessionFixture::~resetOnNewSessionFixture(resetOnNewSessionFixture *this)

{
  anon_unknown.dwarf_334836::sessionFixture::~sessionFixture
            ((sessionFixture *)&this[-1].super_acceptorFixture.super_sessionFixture.factory);
  return;
}

Assistant:

resetOnNewSessionFixture() {
    now.setCurrent();
    startTime = now;
    startTime += -2;
    endTime = now;
    endTime += 2;

    acceptorFixture::createSession(0);
  }